

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O3

void __thiscall
MinVR::VRDisplayNode::_addValueNeeded(VRDisplayNode *this,string *name,bool required)

{
  size_t *psVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base local_38;
  undefined1 local_28;
  
  pcVar2 = (name->_M_dataplus)._M_p;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
  local_28 = required;
  p_Var3 = (_List_node_base *)operator_new(0x38);
  p_Var3[1]._M_next = p_Var3 + 2;
  if (local_48 == &local_38) {
    p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_38._M_next._1_7_,local_38._M_next._0_1_);
    p_Var3[2]._M_prev = local_38._M_prev;
  }
  else {
    p_Var3[1]._M_next = local_48;
    p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_38._M_next._1_7_,local_38._M_next._0_1_);
  }
  p_Var3[1]._M_prev = local_40;
  local_40 = (_List_node_base *)0x0;
  local_38._M_next._0_1_ = 0;
  *(undefined1 *)&p_Var3[3]._M_next = local_28;
  local_48 = &local_38;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->_valuesNeeded).
            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(local_38._M_next._1_7_,local_38._M_next._0_1_) + 1);
  }
  return;
}

Assistant:

void _addValueNeeded(const std::string name, const bool required = true) {
    _valuesNeeded.push_back(std::pair<std::string, bool>(name, required));
  }